

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_weierstrass_multiply(void)

{
  WeierstrassCurve *wc_00;
  WeierstrassPoint *wp;
  mp_int *x;
  WeierstrassPoint *pWVar1;
  WeierstrassPoint *r;
  WeierstrassPoint *A;
  size_t i;
  mp_int *exponent;
  WeierstrassPoint *a;
  WeierstrassCurve *wc;
  
  wc_00 = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc_00);
  x = mp_new(0x38);
  A = (WeierstrassPoint *)0x1;
  while( true ) {
    pWVar1 = (WeierstrassPoint *)(*looplimit)(5);
    if (pWVar1 <= A) break;
    pWVar1 = wpoint(wc_00,(size_t)A);
    ecc_weierstrass_point_copy_into(wp,pWVar1);
    ecc_weierstrass_point_free(pWVar1);
    mp_random_fill(x);
    log_start();
    pWVar1 = ecc_weierstrass_multiply(wp,x);
    log_end();
    ecc_weierstrass_point_free(pWVar1);
    A = (WeierstrassPoint *)((long)&A->X + 1);
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_curve_free(wc_00);
  mp_free(x);
  return;
}

Assistant:

static void test_ecc_weierstrass_multiply(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    mp_int *exponent = mp_new(56);
    for (size_t i = 1; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);
        mp_random_fill(exponent);

        log_start();
        WeierstrassPoint *r = ecc_weierstrass_multiply(a, exponent);
        log_end();

        ecc_weierstrass_point_free(r);
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
    mp_free(exponent);
}